

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 11_struct_as_param.cpp
# Opt level: O2

void convert_rect_to_polar(coord_rect *rect,coord_polar *polar)

{
  double __y;
  double dVar1;
  
  dVar1 = rect->x;
  __y = rect->y;
  polar->distance = SQRT(dVar1 * dVar1 + __y * __y);
  dVar1 = atan2(__y,dVar1);
  polar->rad = dVar1;
  dVar1 = atan2(rect->y,rect->x);
  polar->deg = (dVar1 * 180.0) / 3.1415926;
  return;
}

Assistant:

void convert_rect_to_polar(coord_rect * rect, coord_polar * polar) {
    using namespace std;
//    coord_polar result;

    polar->distance = sqrt(rect->x * rect->x + rect->y * rect->y);
    polar->rad = atan2(rect->y, rect->x);
    polar->deg = 180 * atan2(rect->y, rect->x) / PI;
//    return result;
}